

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O0

int lpack(lua_State *L)

{
  uint uVar1;
  void *srcv;
  void *pvVar2;
  lua_Integer lVar3;
  int osz;
  int bytes;
  void *output;
  size_t maxsz;
  void *buffer;
  size_t sz;
  lua_State *L_local;
  
  buffer = (void *)0x0;
  sz = (size_t)L;
  srcv = getbuffer(L,1,(size_t *)&buffer);
  pvVar2 = (void *)(((long)buffer + 0x7ffU >> 0xb) * 2 + (long)buffer);
  _osz = (char *)lua_touserdata((lua_State *)sz,-0xf4629);
  lVar3 = lua_tointegerx((lua_State *)sz,-0xf462a,(int *)0x0);
  if ((void *)(long)(int)lVar3 < pvVar2) {
    _osz = (char *)expand_buffer((lua_State *)sz,(int)lVar3,(int)pvVar2);
  }
  uVar1 = sproto_pack(srcv,(int)buffer,_osz,(int)pvVar2);
  if (pvVar2 < (void *)(long)(int)uVar1) {
    L_local._4_4_ = luaL_error((lua_State *)sz,"packing error, return size = %d",(ulong)uVar1);
  }
  else {
    lua_pushlstring((lua_State *)sz,_osz,(long)(int)uVar1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int
lpack(lua_State *L) {
	size_t len;
	const char * ptr = tolstring(L, &len, 1);
	if (len > 0x10000) {
		return luaL_error(L, "Invalid size (too long) of data : %d", (int)len);
	}

	uint8_t * buffer = skynet_malloc(len + 2);
	write_size(buffer, len);
	memcpy(buffer+2, ptr, len);

	lua_pushlightuserdata(L, buffer);
	lua_pushinteger(L, len + 2);

	return 2;
}